

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

Result __thiscall
spectest::CommandRunner::OnAssertReturnCommand(CommandRunner *this,AssertReturnCommand *command)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint32_t line_number;
  pointer pEVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ExpectedValue expected;
  TypedValue actual;
  Result RVar6;
  long lVar7;
  Enum EVar8;
  size_t i;
  ulong uVar9;
  long lVar10;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  ActionResult action_result;
  
  RunAction(&action_result,this,
            (command->super_CommandMixin<(wabt::CommandType)7>).super_Command.line,&command->action,
            Quiet);
  if (action_result.trap.obj_ == (Trap *)0x0) {
    lVar7 = ((long)(command->expected).
                   super__Vector_base<spectest::ExpectedValue,_std::allocator<spectest::ExpectedValue>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(command->expected).
                  super__Vector_base<spectest::ExpectedValue,_std::allocator<spectest::ExpectedValue>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x38;
    if (((long)action_result.values.
               super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl
               .super__Vector_impl_data._M_finish -
        (long)action_result.values.
              super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
              super__Vector_impl_data._M_start) / 0x18 == lVar7) {
      lVar10 = 0;
      lVar7 = 0;
      EVar8 = Ok;
      for (uVar9 = 0;
          uVar9 < (ulong)(((long)action_result.values.
                                 super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)action_result.values.
                                super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x18);
          uVar9 = uVar9 + 1) {
        pEVar3 = (command->expected).
                 super__Vector_base<spectest::ExpectedValue,_std::allocator<spectest::ExpectedValue>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uStack_84 = *(undefined4 *)
                     ((long)&((action_result.values.
                               super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                               ._M_impl.super__Vector_impl_data._M_start)->type).enum_ + lVar7);
        puVar1 = (undefined8 *)
                 ((long)&(action_result.values.
                          super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                          ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar7);
        uVar4 = *puVar1;
        uVar5 = puVar1[1];
        uStack_94 = (undefined4)uVar4;
        uStack_90 = (undefined4)((ulong)uVar4 >> 0x20);
        uStack_8c = (undefined4)uVar5;
        uStack_88 = (undefined4)((ulong)uVar5 >> 0x20);
        actual._4_4_ = local_98;
        actual.type.enum_ =
             action_result.types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
             .super__Vector_impl_data._M_start[uVar9].enum_;
        actual.value._20_4_ = uStack_9c;
        actual.value.type.enum_ = uStack_84;
        puVar1 = (undefined8 *)((long)pEVar3->nan + lVar10 + -0x14);
        puVar2 = (undefined8 *)((long)pEVar3->nan + lVar10 + -4);
        expected.value.value.field_0._8_8_ = *puVar1;
        expected.value._0_16_ = *(undefined1 (*) [16])((long)pEVar3->nan + lVar10 + -0x24);
        expected.value.value._16_8_ = puVar1[1];
        expected._32_8_ = *puVar2;
        expected.nan._4_8_ = puVar2[1];
        expected._48_8_ = *(undefined8 *)((long)pEVar3->nan + lVar10 + 0xc);
        actual.value.field_0.i64_ = uVar4;
        actual.value.field_0._8_8_ = uVar5;
        RVar6 = CheckAssertReturnResult(this,command,(int)uVar9,expected,actual,true);
        EVar8 = (Enum)(RVar6.enum_ == Error || EVar8 != Ok);
        lVar7 = lVar7 + 0x18;
        lVar10 = lVar10 + 0x38;
      }
      goto LAB_001897e6;
    }
    PrintError(this,(command->super_CommandMixin<(wabt::CommandType)7>).super_Command.line,
               "result length mismatch in assert_return: expected %zd, got %zd",lVar7);
  }
  else {
    line_number = (command->super_CommandMixin<(wabt::CommandType)7>).super_Command.line;
    std::__cxx11::string::string((string *)&local_98,(string *)&(action_result.trap.obj_)->message_)
    ;
    PrintError(this,line_number,"unexpected trap: %s",CONCAT44(uStack_94,local_98));
    std::__cxx11::string::_M_dispose();
  }
  EVar8 = Error;
LAB_001897e6:
  ActionResult::~ActionResult(&action_result);
  return (Result)EVar8;
}

Assistant:

wabt::Result CommandRunner::OnAssertReturnCommand(
    const AssertReturnCommand* command) {
  ActionResult action_result =
      RunAction(command->line, &command->action, RunVerbosity::Quiet);

  if (action_result.trap) {
    PrintError(command->line, "unexpected trap: %s",
               action_result.trap->message().c_str());
    return wabt::Result::Error;
  }

  if (action_result.values.size() != command->expected.size()) {
    PrintError(command->line,
               "result length mismatch in assert_return: expected %" PRIzd
               ", got %" PRIzd,
               command->expected.size(), action_result.values.size());
    return wabt::Result::Error;
  }

  wabt::Result result = wabt::Result::Ok;
  for (size_t i = 0; i < action_result.values.size(); ++i) {
    const ExpectedValue& expected = command->expected[i];
    TypedValue actual{action_result.types[i], action_result.values[i]};

    result |= CheckAssertReturnResult(command, i, expected, actual, true);
  }

  return result;
}